

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

bool __thiscall re2::SparseArray<int>::has_index(SparseArray<int> *this,int i)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  IndexValue *pIVar4;
  uint in_ESI;
  uint *in_RDI;
  SparseArray<int> *in_stack_ffffffffffffffc8;
  uint7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  bool local_1;
  
  if ((int)in_ESI < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/sparse_array.h"
                  ,0x15e,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
  }
  iVar1 = max_size(in_stack_ffffffffffffffc8);
  if (iVar1 <= (int)in_ESI) {
    __assert_fail("i < max_size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/sparse_array.h"
                  ,0x15f,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
  }
  uVar2 = max_size(in_stack_ffffffffffffffc8);
  if (in_ESI < uVar2) {
    puVar3 = (uint *)PODArray<int>::operator[]
                               ((PODArray<int> *)
                                CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                                (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    local_1 = false;
    if (*puVar3 < *in_RDI) {
      iVar1 = (int)((ulong)(in_RDI + 6) >> 0x20);
      PODArray<int>::operator[]((PODArray<int> *)(ulong)in_stack_ffffffffffffffd0,iVar1);
      pIVar4 = PODArray<re2::SparseArray<int>::IndexValue>::operator[]
                         ((PODArray<re2::SparseArray<int>::IndexValue> *)
                          CONCAT17(local_1,in_stack_ffffffffffffffd0),iVar1);
      local_1 = pIVar4->index_ == in_ESI;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SparseArray<Value>::has_index(int i) const {
  assert(i >= 0);
  assert(i < max_size());
  if (static_cast<uint32_t>(i) >= static_cast<uint32_t>(max_size())) {
    return false;
  }
  // Unsigned comparison avoids checking sparse_[i] < 0.
  return (uint32_t)sparse_[i] < (uint32_t)size_ &&
         dense_[sparse_[i]].index_ == i;
}